

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

bool __thiscall
SQCompilation::NodeEqualChecker::cmpEnumDecl(NodeEqualChecker *this,EnumDecl *l,EnumDecl *r)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type_conflict sVar4;
  size_type_conflict sVar5;
  SQChar *__s1;
  SQChar *__s2;
  ArenaVector<SQCompilation::EnumConst> *this_00;
  ArenaVector<SQCompilation::EnumConst> *this_01;
  EnumConst *pEVar6;
  EnumConst *this_02;
  EnumDecl *in_RDX;
  EnumDecl *in_RSI;
  LiteralExpr *in_RDI;
  EnumConst *rc;
  EnumConst *lc;
  int32_t i;
  ArenaVector<SQCompilation::EnumConst> *rcs;
  ArenaVector<SQCompilation::EnumConst> *lcs;
  undefined4 in_stack_ffffffffffffffb0;
  uint local_34;
  bool local_1;
  
  bVar1 = EnumDecl::isGlobal(in_RSI);
  uVar2 = (uint)bVar1;
  bVar1 = EnumDecl::isGlobal(in_RDX);
  if (uVar2 == bVar1) {
    __s1 = EnumDecl::name(in_RSI);
    __s2 = EnumDecl::name(in_RDX);
    iVar3 = strcmp(__s1,__s2);
    if (iVar3 == 0) {
      this_00 = EnumDecl::consts(in_RSI);
      this_01 = EnumDecl::consts(in_RDX);
      sVar4 = ArenaVector<SQCompilation::EnumConst>::size(this_00);
      sVar5 = ArenaVector<SQCompilation::EnumConst>::size(this_01);
      if (sVar4 == sVar5) {
        for (local_34 = 0; sVar4 = ArenaVector<SQCompilation::EnumConst>::size(this_00),
            local_34 < sVar4; local_34 = local_34 + 1) {
          pEVar6 = ArenaVector<SQCompilation::EnumConst>::operator[](this_00,local_34);
          this_02 = ArenaVector<SQCompilation::EnumConst>::operator[](this_01,local_34);
          iVar3 = strcmp(pEVar6->id,this_02->id);
          if (iVar3 != 0) {
            return false;
          }
          bVar1 = cmpLiterals((NodeEqualChecker *)this_02,
                              (LiteralExpr *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),in_RDI);
          if (!bVar1) {
            return false;
          }
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool cmpEnumDecl(const EnumDecl *l, const EnumDecl *r) const {
    if (l->isGlobal() != r->isGlobal())
      return false;

    if (strcmp(l->name(), r->name()) != 0)
      return false;

    const auto &lcs = l->consts();
    const auto &rcs = r->consts();

    if (lcs.size() != rcs.size())
      return false;

    for (int32_t i = 0; i < lcs.size(); ++i) {
      const auto &lc = lcs[i];
      const auto &rc = rcs[i];

      if (strcmp(lc.id, rc.id) != 0)
        return false;

      if (!cmpLiterals(lc.val, rc.val))
        return false;
    }

    return true;
  }